

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vr2i.cpp
# Opt level: O0

bool * __thiscall Vr2i::steps(Vr2i *this,int *n)

{
  bool *pbVar1;
  ulong uVar2;
  int local_50;
  int local_4c;
  bool *vecsteps;
  int local_30;
  int i;
  int x;
  int e;
  int dy;
  int dx;
  int y2;
  int x2;
  int *n_local;
  Vr2i *this_local;
  
  if (this->xv < 1) {
    local_4c = -this->xv;
  }
  else {
    local_4c = this->xv;
  }
  dx = local_4c;
  if (this->yv < 1) {
    local_50 = -this->yv;
  }
  else {
    local_50 = this->yv;
  }
  x = local_50;
  if (local_4c < local_50) {
    x = local_4c;
    dx = local_50;
  }
  local_30 = 0;
  vecsteps._4_4_ = 0;
  *n = dx;
  uVar2 = (ulong)dx;
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pbVar1 = (bool *)operator_new__(uVar2);
  i = dx;
  while (local_30 < dx) {
    local_30 = local_30 + 1;
    i = i + x * -2;
    if (i < 0) {
      i = dx * 2 + i;
      pbVar1[vecsteps._4_4_] = true;
    }
    else {
      pbVar1[vecsteps._4_4_] = false;
    }
    vecsteps._4_4_ = vecsteps._4_4_ + 1;
  }
  return pbVar1;
}

Assistant:

bool *Vr2i::steps (int *n) const
{
  int x2 = (xv > 0 ? xv : - xv);
  int y2 = (yv > 0 ? yv : - yv);
  int dx = x2, dy = y2;
  if (y2 > x2)
  {
    dx = y2;
    dy = x2;
    x2 = y2;
  }
  int e, x = 0, i = 0;
  *n = x2;
  bool *vecsteps = new bool[x2];

  e = dx;
  dx *= 2;
  dy *= 2;

  while (x < x2)
  {
    x ++;
    e -= dy;
    if (e < 0)
    {
      e += dx;
      vecsteps[i++] = true;
    }
    else vecsteps[i++] = false;
  }
  return (vecsteps); 
}